

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  float fVar1;
  float fVar2;
  bool bVar3;
  int z;
  long lVar4;
  Vec4 *b;
  Vec3 *pVVar5;
  int y;
  Vec3 *s;
  uint uVar6;
  uint uVar7;
  float width;
  float height;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Texture2DArrayView TVar14;
  Vec2 coordDxo;
  Vec2 lodO;
  Vec2 clampedLod;
  Vec2 coordDx;
  Vec2 lodBounds;
  Vec2 srcSize;
  Vec2 coordDy;
  Vec3 coord;
  Vec2 lodBias;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Texture2DArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  undefined1 local_1d0 [16];
  Vec2 local_1c0;
  long local_1b8;
  int local_1ac;
  float local_1a8;
  int local_1a4;
  ReferenceParams *local_1a0;
  Vec4 *local_198;
  float local_190;
  float local_18c;
  Vector<bool,_4> local_188;
  float local_184;
  Vec4 *local_180;
  Vec3 *local_178;
  Vector<float,_2> local_170;
  float local_168;
  float local_164;
  Vector<float,_2> local_160;
  PixelBufferAccess *local_158;
  Vec4 *local_150;
  ConstPixelBufferAccess *local_148;
  ConstPixelBufferAccess *local_140;
  float local_138;
  float local_134;
  undefined1 local_130 [20];
  float local_11c;
  Vector<float,_4> local_118;
  Vec4 local_108;
  Vec3 local_f8;
  undefined4 local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  Vec3 local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  Sampler *local_a0;
  Texture2DArrayView local_98;
  Vector<int,_2> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Vec3 local_68;
  float fStack_5c;
  undefined8 local_58;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = &sampleParams->sampler;
  local_1a0 = sampleParams;
  local_158 = errorMask;
  TVar14 = tcu::getEffectiveTextureView
                     (baseView,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                *)&local_48,local_a0);
  local_98.m_levels = TVar14.m_levels;
  local_98.m_numLevels = TVar14.m_numLevels;
  local_88.m_data[0] = 0;
  local_88.m_data[1] = 0;
  if (0 < local_98.m_numLevels) {
    local_88.m_data = *(int (*) [2])((local_98.m_levels)->m_size).m_data;
  }
  local_198 = (Vec4 *)CONCAT44(local_198._4_4_,*texCoord);
  fVar11 = texCoord[1];
  fVar1 = texCoord[3];
  local_178 = (Vec3 *)CONCAT44(local_178._4_4_,texCoord[6]);
  fVar2 = texCoord[9];
  fVar10 = texCoord[4];
  fVar12 = texCoord[7];
  fVar13 = texCoord[10];
  fVar8 = texCoord[2];
  width = (float)(result->m_size).m_data[0];
  local_1b8 = CONCAT44(local_1b8._4_4_,texCoord[5]);
  height = (float)(result->m_size).m_data[1];
  fVar9 = texCoord[8];
  local_180 = (Vec4 *)CONCAT44(local_180._4_4_,texCoord[0xb]);
  tcu::Vector<int,_2>::cast<float>(&local_88);
  local_b8.m_data[0] = local_198._0_4_;
  local_b8.m_data[2] = local_178._0_4_;
  local_a8 = local_178._0_4_;
  local_f8.m_data[1] = (float)local_1b8;
  local_ec = local_180._0_4_;
  local_e4 = (float)local_1b8;
  local_68.m_data[0] = (local_1a0->super_RenderParams).w.m_data[0];
  local_68.m_data[1] = (local_1a0->super_RenderParams).w.m_data[1];
  local_68.m_data[2] = (local_1a0->super_RenderParams).w.m_data[2];
  fStack_5c = (local_1a0->super_RenderParams).w.m_data[3];
  local_58 = CONCAT44(local_68.m_data[1],local_68.m_data[2]);
  local_130._16_4_ = 0.0;
  if (((local_1a0->super_RenderParams).flags & 2) != 0) {
    local_130._16_4_ = (local_1a0->super_RenderParams).bias;
  }
  local_88.m_data[0] = -0x40800000;
  local_88.m_data[1] = 0;
  uStack_80 = 0x3f800000;
  local_78 = 0xbf80000000000000;
  uStack_70 = 0x3f80000000000000;
  local_118.m_data[0] = -1.7146522e+38;
  local_11c = (float)local_130._16_4_;
  local_f8.m_data[0] = fVar8;
  local_f8.m_data[2] = fVar9;
  local_e8 = fVar9;
  local_d8.m_data[0] = fVar11;
  local_d8.m_data[1] = fVar10;
  local_d8.m_data[2] = fVar12;
  local_cc = fVar13;
  local_c8 = fVar12;
  local_c4 = fVar10;
  local_b8.m_data[1] = fVar1;
  local_ac = fVar2;
  local_a4 = fVar1;
  tcu::RGBA::toVec((RGBA *)&local_118);
  tcu::clear(local_158,&local_108);
  b = &(local_1a0->super_RenderParams).colorBias;
  local_198 = &(local_1a0->super_RenderParams).colorScale;
  local_180 = &lookupPrec->colorThreshold;
  local_1ac = 0;
  local_150 = b;
  local_148 = result;
  local_140 = reference;
  for (z = 0; z < (result->m_size).m_data[1]; z = z + 1) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    fVar11 = (float)z + 0.5;
    local_1a8 = fVar11 / height;
    local_164 = height - fVar11;
    local_168 = 1.0 - local_1a8;
    for (y = 0; y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_1d0,(int)result,y,z);
      tcu::operator-((tcu *)&local_118,(Vector<float,_4> *)local_1d0,b);
      tcu::operator/((tcu *)&local_108,&local_118,local_198);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_130,(int)reference,y,z);
      tcu::operator-((tcu *)local_1d0,(Vector<float,_4> *)local_130,b);
      tcu::operator/((tcu *)&local_118,(Vector<float,_4> *)local_1d0,local_198);
      tcu::operator-((tcu *)local_130,&local_108,&local_118);
      tcu::abs<float,4>((tcu *)local_1d0,(Vector<float,_4> *)local_130);
      tcu::lessThanEqual<float,4>((tcu *)&local_188,(Vector<float,_4> *)local_1d0,local_180);
      bVar3 = tcu::boolAll<4>(&local_188);
      if (!bVar3) {
        fVar13 = (float)y + 0.5;
        fVar12 = fVar13 / width;
        bVar3 = 1.0 <= local_1a8 + fVar12;
        fVar10 = local_1a8;
        fVar1 = fVar13;
        fVar2 = fVar11;
        if (bVar3) {
          fVar12 = 1.0 - fVar12;
          fVar10 = local_168;
          fVar1 = width - fVar13;
          fVar2 = local_164;
        }
        pVVar5 = &local_b8 + bVar3;
        w = &local_68 + bVar3;
        local_1a4 = y;
        fVar8 = projectedTriInterpolate(pVVar5,w,fVar12,fVar10);
        s = &local_d8 + bVar3;
        fVar9 = projectedTriInterpolate(s,w,fVar12,fVar10);
        local_1b8 = CONCAT44(local_1b8._4_4_,fVar9);
        local_130._8_4_ = projectedTriInterpolate(&local_f8 + bVar3,w,fVar12,fVar10);
        local_130._4_4_ = (float)local_1b8;
        local_130._0_4_ = fVar8;
        fVar8 = triDerivateX(pVVar5,w,fVar13,width,fVar10);
        local_1d0._4_4_ = triDerivateX(s,w,fVar13,width,fVar10);
        local_1d0._0_4_ = fVar8;
        tcu::operator*((Vector<float,_2> *)local_1d0,&local_160);
        fVar10 = triDerivateY(pVVar5,w,fVar11,height,fVar12);
        local_1d0._4_4_ = triDerivateY(s,w,fVar11,height,fVar12);
        local_1d0._0_4_ = fVar10;
        tcu::operator*((Vector<float,_2> *)local_1d0,&local_160);
        tcu::computeLodBoundsFromDerivates
                  ((tcu *)&local_170,(float)local_188.m_data,local_184,local_138,local_134,lodPrec);
        lVar4 = 0;
        local_178 = pVVar5;
        while (pVVar5 = local_178, lVar4 != 4) {
          fVar10 = (float)(&local_88)[lVar4].m_data[0] + fVar1;
          fVar13 = (float)(&local_88)[lVar4].m_data[1] + fVar2;
          local_1b8 = lVar4;
          fVar12 = triDerivateX(local_178,w,fVar10,width,fVar13 / height);
          local_18c = triDerivateX(s,w,fVar10,width,fVar13 / height);
          local_190 = fVar12;
          tcu::operator*((Vector<float,_2> *)&local_190,&local_160);
          fVar12 = triDerivateY(pVVar5,w,fVar13,height,fVar10 / width);
          local_1c0.m_data[1] = triDerivateY(s,w,fVar13,height,fVar10 / width);
          local_1c0.m_data[0] = fVar12;
          tcu::operator*((Vector<float,_2> *)&local_1c0,&local_160);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&local_1c0,(float)local_1d0._0_4_,(float)local_1d0._4_4_,local_190,
                     local_18c,lodPrec);
          uVar6 = -(uint)(local_170.m_data[0] <= local_1c0.m_data[0]);
          uVar7 = -(uint)(local_1c0.m_data[1] <= local_170.m_data[1]);
          local_170.m_data[0] =
               (float)(~uVar6 & (uint)local_1c0.m_data[0] | (uint)local_170.m_data[0] & uVar6);
          local_170.m_data[1] =
               (float)(~uVar7 & (uint)local_1c0.m_data[1] | (uint)local_170.m_data[1] & uVar7);
          lVar4 = local_1b8 + 1;
        }
        tcu::operator+(&local_170,(Vector<float,_2> *)(local_130 + 0x10));
        local_1c0.m_data[0] = local_1a0->minLod;
        local_1c0.m_data[1] = local_1a0->maxLod;
        tcu::clampLodBounds((tcu *)&local_190,(Vec2 *)local_1d0,&local_1c0,lodPrec);
        bVar3 = tcu::isLookupResultValid
                          (&local_98,local_a0,lookupPrec,(Vec3 *)local_130,(Vec2 *)&local_190,
                           &local_108);
        b = local_150;
        result = local_148;
        reference = local_140;
        y = local_1a4;
        if (!bVar3) {
          local_1c0.m_data[0] = -1.7014636e+38;
          tcu::RGBA::toVec((RGBA *)&local_1c0);
          reference = local_140;
          result = local_148;
          b = local_150;
          y = local_1a4;
          tcu::PixelBufferAccess::setPixel(local_158,(Vec4 *)local_1d0,local_1a4,z,0);
          local_1ac = local_1ac + 1;
        }
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_48);
  return local_1ac;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::Vec2								srcSize				= tcu::IVec2(src.getWidth(), src.getHeight()).asFloat(); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize;
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize;
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}